

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse2_128_32.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_diag_sse2_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int32_t iVar1;
  int *piVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  parasail_result_t *ppVar9;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  int32_t *ptr_02;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  int iVar52;
  int iVar53;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar54;
  undefined1 auVar55 [16];
  undefined1 local_1a8 [16];
  int local_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  undefined1 local_178 [16];
  undefined1 local_158 [16];
  undefined1 local_118 [16];
  int *local_100;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  int iVar33;
  int iVar34;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_diag_sse2_128_32_cold_7();
    return (parasail_result_t *)0x0;
  }
  if (s2Len < 1) {
    parasail_sg_flags_diag_sse2_128_32_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sg_flags_diag_sse2_128_32_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sg_flags_diag_sse2_128_32_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_diag_sse2_128_32_cold_3();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_diag_sse2_128_32_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_sg_flags_diag_sse2_128_32_cold_1();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    _s1Len = matrix->length;
  }
  iVar24 = _s1Len + 3;
  uVar7 = s2Len + 3;
  iVar17 = -open;
  iVar13 = matrix->min;
  uVar8 = 0x80000000 - iVar13;
  if (iVar13 != iVar17 && SBORROW4(iVar13,iVar17) == iVar13 + open < 0) {
    uVar8 = open | 0x80000000;
  }
  iVar13 = uVar8 + 1;
  iVar23 = 0x7ffffffe - matrix->max;
  local_158 = (undefined1  [16])0x0;
  if (s1_beg == 0) {
    local_f8 = gap << 2;
    iStack_f4 = gap << 2;
    iStack_f0 = gap << 2;
    iStack_ec = gap << 2;
  }
  else {
    local_f8 = 0;
    iStack_f4 = 0;
    iStack_f0 = 0;
    iStack_ec = 0;
  }
  local_b8._0_8_ = CONCAT44(iVar13,iVar13);
  local_b8._8_8_ = CONCAT44(iVar13,iVar13);
  local_c8._8_8_ = local_b8._8_8_;
  local_c8._0_8_ = local_b8._0_8_;
  local_d8._8_8_ = local_b8._8_8_;
  local_d8._0_8_ = local_b8._0_8_;
  local_118._8_8_ = local_b8._8_8_;
  local_118._0_8_ = local_b8._0_8_;
  local_e8._8_8_ = local_b8._8_8_;
  local_e8._0_8_ = local_b8._0_8_;
  if (s1_beg == 0) {
    local_158._4_4_ = iVar17 + gap * -2;
    local_158._0_4_ = -(gap * 3 + open);
    local_158._12_4_ = iVar17;
    local_158._8_4_ = iVar17 - gap;
  }
  local_48 = gap;
  iStack_44 = gap;
  iStack_40 = gap;
  iStack_3c = gap;
  ppVar9 = parasail_result_new();
  if (ppVar9 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar9->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar9->flag | 0x4401002;
  uVar12 = (ulong)(s2Len + 6);
  ptr = parasail_memalign_int32_t(0x10,uVar12);
  ptr_00 = parasail_memalign_int32_t(0x10,uVar12);
  ptr_01 = parasail_memalign_int32_t(0x10,uVar12);
  if (ptr_01 == (int32_t *)0x0 || (ptr_00 == (int32_t *)0x0 || ptr == (int32_t *)0x0)) {
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    ptr_02 = parasail_memalign_int32_t(0x10,(long)iVar24);
    if (ptr_02 == (int32_t *)0x0) {
      return (parasail_result_t *)0x0;
    }
    if (0 < _s1Len) {
      piVar2 = matrix->mapper;
      uVar12 = 0;
      do {
        ptr_02[uVar12] = piVar2[(byte)_s1[uVar12]];
        uVar12 = uVar12 + 1;
      } while ((uint)_s1Len != uVar12);
    }
    iVar18 = _s1Len + 1U;
    if ((int)(_s1Len + 1U) < iVar24) {
      iVar18 = iVar24;
    }
    memset(ptr_02 + _s1Len,0,(ulong)(uint)(~_s1Len + iVar18) * 4 + 4);
  }
  else {
    ptr_02 = (int32_t *)0x0;
  }
  local_98 = _s1Len - 1;
  iStack_94 = _s1Len - 1;
  iStack_90 = _s1Len - 1;
  iStack_8c = _s1Len - 1;
  local_68 = s2Len + -1;
  iStack_64 = s2Len + -1;
  iStack_60 = s2Len + -1;
  iStack_5c = s2Len + -1;
  piVar2 = matrix->mapper;
  uVar15 = (ulong)(uint)s2Len;
  uVar12 = 0;
  do {
    ptr[uVar12 + 3] = piVar2[(byte)_s2[uVar12]];
    uVar12 = uVar12 + 1;
  } while (uVar15 != uVar12);
  ptr[2] = 0;
  ptr[0] = 0;
  ptr[1] = 0;
  uVar8 = s2Len + 1U;
  if ((int)(s2Len + 1U) < (int)uVar7) {
    uVar8 = uVar7;
  }
  local_88 = open;
  iStack_84 = open;
  iStack_80 = open;
  iStack_7c = open;
  local_78 = s2Len;
  iStack_74 = s2Len;
  iStack_70 = s2Len;
  iStack_6c = s2Len;
  local_58 = _s1Len;
  uStack_54 = _s1Len;
  uStack_50 = _s1Len;
  uStack_4c = _s1Len;
  memset(ptr + uVar15 + 3,0,(ulong)(~s2Len + uVar8) * 4 + 4);
  uVar12 = 0;
  iVar24 = iVar17;
  if (s2_beg == 0) {
    do {
      ptr_00[uVar12 + 3] = iVar24;
      ptr_01[uVar12 + 3] = iVar13;
      uVar12 = uVar12 + 1;
      iVar24 = iVar24 - gap;
    } while (uVar15 != uVar12);
  }
  else {
    do {
      ptr_00[uVar12 + 3] = 0;
      ptr_01[uVar12 + 3] = iVar13;
      uVar12 = uVar12 + 1;
    } while (uVar15 != uVar12);
  }
  lVar10 = 0;
  do {
    ptr_00[lVar10] = iVar13;
    ptr_01[lVar10] = iVar13;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = uVar15 + 3;
  iVar24 = s2Len;
  do {
    ptr_00[lVar10] = iVar13;
    ptr_01[lVar10] = iVar13;
    lVar10 = lVar10 + 1;
    iVar24 = iVar24 + 1;
  } while (iVar24 < (int)uVar7);
  ptr_00[2] = 0;
  local_d8._4_4_ = iVar13;
  local_d8._0_4_ = iVar13;
  local_d8._8_4_ = iVar13;
  local_d8._12_4_ = iVar13;
  local_178 = local_d8;
  local_e8 = local_d8;
  local_118 = local_d8;
  local_1a8._0_4_ = iVar23;
  local_1a8._4_4_ = iVar23;
  local_1a8._8_4_ = iVar23;
  local_1a8._12_4_ = iVar23;
  if (0 < _s1Len) {
    local_100 = matrix->matrix;
    uVar8 = _s1Len - 1;
    auVar4._4_4_ = iVar13;
    auVar4._0_4_ = iVar13;
    auVar4._8_4_ = iVar13;
    auVar4._12_4_ = iVar13;
    local_a8 = auVar4 >> 0x20;
    uVar12 = 1;
    if (1 < (int)uVar7) {
      uVar12 = (ulong)uVar7;
    }
    uVar11 = (ulong)(uint)_s1Len;
    local_188 = 3;
    iStack_184 = 2;
    iStack_180 = 1;
    iStack_17c = 0;
    uVar15 = 0;
    local_d8 = auVar4;
    local_e8 = auVar4;
    local_b8 = auVar4;
    local_118 = auVar4;
    local_c8 = auVar4;
    local_178 = auVar4;
    do {
      uVar7 = (uint)uVar15;
      if (matrix->type == 0) {
        uVar19 = ptr_02[uVar15 + 1];
        uVar21 = ptr_02[uVar15 + 2];
        uVar14 = ptr_02[uVar15];
        uVar25 = ptr_02[uVar15 | 3];
      }
      else {
        uVar19 = uVar7 | 1;
        if (uVar11 <= (uVar15 | 1)) {
          uVar19 = uVar8;
        }
        uVar21 = uVar7 | 2;
        if (uVar11 <= (uVar15 | 2)) {
          uVar21 = uVar8;
        }
        uVar14 = uVar7;
        uVar25 = uVar7 | 3;
        if (uVar11 <= (uVar15 | 3)) {
          uVar25 = uVar8;
        }
      }
      iVar24 = matrix->size;
      uVar15 = uVar15 + 4;
      iVar18 = iVar17 - uVar7 * gap;
      iVar1 = ptr_00[2];
      ptr_00[2] = iVar17 - (int)uVar15 * gap;
      if (s1_beg != 0) {
        iVar18 = 0;
      }
      auVar51._0_12_ = auVar4._4_12_;
      auVar51._12_4_ = iVar18;
      auVar29._12_4_ = iVar1;
      auVar29._0_12_ = auVar51._0_12_;
      uVar16 = 0;
      auVar35._4_4_ = iVar13;
      auVar35._0_4_ = iVar13;
      auVar35._8_4_ = iVar13;
      auVar35._12_4_ = iVar13;
      auVar27 = _DAT_00904cb0;
      auVar41 = auVar35;
      do {
        auVar44._0_4_ = local_100[(long)(int)(uVar25 * iVar24) + (long)ptr[uVar16]] + auVar29._0_4_;
        auVar44._4_4_ =
             local_100[(long)(int)(uVar21 * iVar24) + (long)ptr[uVar16 + 1]] + auVar29._4_4_;
        auVar44._8_4_ =
             local_100[(long)(int)(uVar19 * iVar24) + (long)ptr[uVar16 + 2]] + auVar29._8_4_;
        auVar44._12_4_ =
             local_100[(long)(int)(uVar14 * iVar24) + (long)ptr[uVar16 + 3]] + auVar29._12_4_;
        auVar29._0_12_ = auVar51._4_12_;
        auVar29._12_4_ = ptr_00[uVar16 + 3];
        auVar42._0_4_ = auVar51._4_4_ - local_88;
        auVar42._4_4_ = auVar51._8_4_ - iStack_84;
        auVar42._8_4_ = auVar51._12_4_ - iStack_80;
        auVar42._12_4_ = ptr_00[uVar16 + 3] - iStack_7c;
        auVar39._0_4_ = auVar35._4_4_ - local_48;
        auVar39._4_4_ = auVar35._8_4_ - iStack_44;
        auVar39._8_4_ = auVar35._12_4_ - iStack_40;
        auVar39._12_4_ = ptr_01[uVar16 + 3] - iStack_3c;
        auVar46._0_4_ = -(uint)(auVar39._0_4_ < auVar42._0_4_);
        auVar46._4_4_ = -(uint)(auVar39._4_4_ < auVar42._4_4_);
        auVar46._8_4_ = -(uint)(auVar39._8_4_ < auVar42._8_4_);
        auVar46._12_4_ = -(uint)(auVar39._12_4_ < auVar42._12_4_);
        auVar35 = ~auVar46 & auVar39 | auVar42 & auVar46;
        auVar50._0_4_ = auVar51._0_4_ - local_88;
        auVar50._4_4_ = auVar51._4_4_ - iStack_84;
        auVar50._8_4_ = auVar51._8_4_ - iStack_80;
        auVar50._12_4_ = auVar51._12_4_ - iStack_7c;
        auVar55._0_4_ = auVar41._0_4_ - local_48;
        auVar55._4_4_ = auVar41._4_4_ - iStack_44;
        auVar55._8_4_ = auVar41._8_4_ - iStack_40;
        auVar55._12_4_ = auVar41._12_4_ - iStack_3c;
        auVar45._0_4_ = -(uint)(auVar55._0_4_ < auVar50._0_4_);
        auVar45._4_4_ = -(uint)(auVar55._4_4_ < auVar50._4_4_);
        auVar45._8_4_ = -(uint)(auVar55._8_4_ < auVar50._8_4_);
        auVar45._12_4_ = -(uint)(auVar55._12_4_ < auVar50._12_4_);
        auVar46 = ~auVar45 & auVar55 | auVar50 & auVar45;
        auVar40._0_4_ = -(uint)(auVar46._0_4_ < auVar44._0_4_);
        auVar40._4_4_ = -(uint)(auVar46._4_4_ < auVar44._4_4_);
        auVar40._8_4_ = -(uint)(auVar46._8_4_ < auVar44._8_4_);
        auVar40._12_4_ = -(uint)(auVar46._12_4_ < auVar44._12_4_);
        auVar41 = ~auVar40 & auVar46 | auVar44 & auVar40;
        auVar43._0_4_ = -(uint)(auVar35._0_4_ < auVar41._0_4_);
        auVar43._4_4_ = -(uint)(auVar35._4_4_ < auVar41._4_4_);
        auVar43._8_4_ = -(uint)(auVar35._8_4_ < auVar41._8_4_);
        auVar43._12_4_ = -(uint)(auVar35._12_4_ < auVar41._12_4_);
        auVar44 = ~auVar43 & auVar35 | auVar41 & auVar43;
        iVar18 = auVar27._0_4_;
        auVar30._0_4_ = -(uint)(iVar18 == -1);
        iVar33 = auVar27._4_4_;
        auVar30._4_4_ = -(uint)(iVar33 == -1);
        iVar22 = auVar27._8_4_;
        iVar34 = auVar27._12_4_;
        auVar30._8_4_ = -(uint)(iVar22 == -1);
        auVar30._12_4_ = -(uint)(iVar34 == -1);
        auVar51 = local_158 & auVar30 | ~auVar30 & auVar44;
        auVar41._4_4_ = iVar13;
        auVar41._0_4_ = iVar13;
        auVar41._8_4_ = iVar13;
        auVar41._12_4_ = iVar13;
        auVar35 = ~auVar30 & auVar35 | auVar41 & auVar30;
        iVar20 = auVar51._0_4_;
        iVar52 = auVar51._4_4_;
        iVar54 = auVar51._12_4_;
        iVar53 = auVar51._8_4_;
        if (3 < uVar16) {
          auVar36._0_4_ = -(uint)(iVar20 < local_1a8._0_4_);
          auVar36._4_4_ = -(uint)(iVar52 < local_1a8._4_4_);
          auVar36._8_4_ = -(uint)(iVar53 < local_1a8._8_4_);
          auVar36._12_4_ = -(uint)(iVar54 < local_1a8._12_4_);
          local_1a8 = ~auVar36 & local_1a8 | auVar51 & auVar36;
          auVar47._0_4_ = -(uint)(iVar20 < local_178._0_4_);
          auVar47._4_4_ = -(uint)(iVar52 < local_178._4_4_);
          auVar47._8_4_ = -(uint)(iVar53 < local_178._8_4_);
          auVar47._12_4_ = -(uint)(iVar54 < local_178._12_4_);
          local_178 = local_178 & auVar47 | ~auVar47 & auVar51;
        }
        auVar41 = auVar41 & auVar30 | ~auVar30 & auVar46;
        auVar5._4_4_ = iStack_184;
        auVar5._0_4_ = local_188;
        auVar5._8_4_ = iStack_180;
        auVar5._12_4_ = iStack_17c;
        auVar31._0_4_ = -(uint)(local_188 < (int)local_58);
        auVar31._4_4_ = -(uint)(iStack_184 < (int)uStack_54);
        auVar31._8_4_ = -(uint)(iStack_180 < (int)uStack_50);
        auVar31._12_4_ = -(uint)(iStack_17c < (int)uStack_4c);
        auVar37._0_4_ = -(uint)(local_68 == iVar18);
        auVar37._4_4_ = -(uint)(iStack_64 == iVar33);
        auVar37._8_4_ = -(uint)(iStack_60 == iVar22);
        auVar37._12_4_ = -(uint)(iStack_5c == iVar34);
        auVar38._0_4_ = -(uint)(iVar18 < local_78);
        auVar38._4_4_ = -(uint)(iVar33 < iStack_74);
        auVar38._8_4_ = -(uint)(iVar22 < iStack_70);
        auVar38._12_4_ = -(uint)(iVar34 < iStack_6c);
        auVar48._0_4_ = iVar18 >> 0x1f;
        auVar48._4_4_ = iVar33 >> 0x1f;
        auVar48._8_4_ = iVar22 >> 0x1f;
        auVar48._12_4_ = iVar34 >> 0x1f;
        auVar49._0_4_ = -(uint)(local_b8._0_4_ < iVar20);
        auVar49._4_4_ = -(uint)(local_b8._4_4_ < iVar52);
        auVar49._8_4_ = -(uint)(local_b8._8_4_ < iVar53);
        auVar49._12_4_ = -(uint)(local_b8._12_4_ < iVar54);
        auVar6._4_4_ = -(uint)(iStack_94 == iStack_184);
        auVar6._0_4_ = -(uint)(local_98 == local_188);
        auVar6._8_4_ = -(uint)(iStack_90 == iStack_180);
        auVar6._12_4_ = -(uint)(iStack_8c == iStack_17c);
        auVar49 = ~auVar48 & auVar38 & auVar6 & auVar49;
        auVar32._0_4_ = -(uint)(local_c8._0_4_ < iVar20);
        auVar32._4_4_ = -(uint)(local_c8._4_4_ < iVar52);
        auVar32._8_4_ = -(uint)(local_c8._8_4_ < iVar53);
        auVar32._12_4_ = -(uint)(local_c8._12_4_ < iVar54);
        auVar32 = auVar31 & auVar37 & auVar32;
        local_b8 = auVar44 & auVar49 | ~auVar49 & local_b8;
        local_c8 = auVar51 & auVar32 | ~auVar32 & local_c8;
        local_d8 = ~(auVar37 & auVar6) & local_d8 | auVar51 & auVar37 & auVar6;
        local_118 = ~auVar32 & local_118 | auVar5 & auVar32;
        local_e8 = ~auVar49 & local_e8 | auVar27 & auVar49;
        ptr_00[uVar16] = iVar20;
        ptr_01[uVar16] = auVar35._0_4_;
        auVar27._0_4_ = iVar18 + 1;
        auVar27._4_4_ = iVar33 + 1;
        auVar27._8_4_ = iVar22 + 1;
        auVar27._12_4_ = iVar34 + 1;
        uVar16 = uVar16 + 1;
      } while (uVar12 != uVar16);
      local_188 = local_188 + 4;
      iStack_184 = iStack_184 + 4;
      iStack_180 = iStack_180 + 4;
      iStack_17c = iStack_17c + 4;
      local_158._4_4_ = local_158._4_4_ - iStack_f4;
      local_158._0_4_ = local_158._0_4_ - local_f8;
      local_158._8_4_ = local_158._8_4_ - iStack_f0;
      local_158._12_4_ = local_158._12_4_ - iStack_ec;
    } while (uVar15 < uVar11);
  }
  lVar10 = 0;
  iVar34 = 0;
  iVar22 = 0;
  iVar17 = 0;
  iVar24 = iVar13;
  iVar18 = iVar13;
  iVar33 = iVar13;
  do {
    iVar20 = *(int *)(local_c8 + lVar10 * 4);
    if (iVar18 < iVar20) {
      iVar18 = iVar20;
      iVar22 = *(int *)(local_118 + lVar10 * 4);
      iVar34 = *(int *)(local_118 + lVar10 * 4);
    }
    else if ((iVar20 == iVar18) &&
            (iVar52 = *(int *)(local_118 + lVar10 * 4), bVar3 = iVar52 < iVar22, iVar22 = iVar34,
            bVar3)) {
      iVar18 = iVar20;
      iVar22 = iVar52;
      iVar34 = iVar52;
    }
    if (iVar33 < *(int *)(local_b8 + lVar10 * 4)) {
      iVar17 = *(int *)(local_e8 + lVar10 * 4);
      iVar33 = *(int *)(local_b8 + lVar10 * 4);
    }
    if (iVar24 < *(int *)(local_d8 + lVar10 * 4)) {
      iVar24 = *(int *)(local_d8 + lVar10 * 4);
    }
    lVar10 = lVar10 + 1;
  } while ((int)lVar10 != 4);
  iVar34 = iVar17;
  if (s1_end == 0 || s2_end == 0) {
    if (s1_end != 0) goto LAB_0056dc46;
    iVar34 = s2Len + -1;
    if (s2_end != 0) {
      iVar24 = iVar33;
      iVar34 = iVar17;
    }
  }
  else {
    if (iVar33 < iVar18) {
LAB_0056dc46:
      iVar20 = s2Len + -1;
      goto LAB_0056dc91;
    }
    iVar24 = iVar33;
    if ((iVar18 == iVar33) && (iVar20 = s2Len + -1, iVar17 == iVar20)) goto LAB_0056dc91;
  }
  iVar20 = iVar34;
  iVar18 = iVar24;
  iVar22 = _s1Len - 1;
LAB_0056dc91:
  auVar26._0_4_ = -(uint)((int)local_1a8._0_4_ < iVar13);
  auVar26._4_4_ = -(uint)((int)local_1a8._4_4_ < iVar13);
  auVar26._8_4_ = -(uint)((int)local_1a8._8_4_ < iVar13);
  auVar26._12_4_ = -(uint)((int)local_1a8._12_4_ < iVar13);
  auVar28._0_4_ = -(uint)(iVar23 < local_178._0_4_);
  auVar28._4_4_ = -(uint)(iVar23 < local_178._4_4_);
  auVar28._8_4_ = -(uint)(iVar23 < local_178._8_4_);
  auVar28._12_4_ = -(uint)(iVar23 < local_178._12_4_);
  iVar13 = movmskps(iVar17,auVar28 | auVar26);
  if (iVar13 != 0) {
    *(byte *)&ppVar9->flag = (byte)ppVar9->flag | 0x40;
    iVar18 = 0;
    iVar20 = 0;
    iVar22 = 0;
  }
  ppVar9->score = iVar18;
  ppVar9->end_query = iVar22;
  ppVar9->end_ref = iVar20;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(ptr_02);
    return ppVar9;
  }
  return ppVar9;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = s1_beg ? _mm_set1_epi32(0) : _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi32(0) : _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m128i vIltLimit = _mm_cmplt_epi32(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi32(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 4);
        vNH = _mm_insert_epi32_rpl(vNH, H_pr[-1], 3);
        vWH = _mm_srli_si128(vWH, 4);
        vWH = _mm_insert_epi32_rpl(vWH, s1_beg ? 0 : (-open - i*gap), 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32_rpl(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32_rpl(vF, F_pr[j], 3);
            vF = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32_rpl(vNWH, vE);
            vWH = _mm_max_epi32_rpl(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32_rpl(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32_rpl(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi32(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi32(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi32(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi32(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8_rpl(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8_rpl(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8_rpl(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int32_t max_row = NEG_LIMIT;
        int32_t max_col = NEG_LIMIT;
        int32_t last_val = NEG_LIMIT;
        int32_t *s = (int32_t*)&vMaxHRow;
        int32_t *t = (int32_t*)&vMaxHCol;
        int32_t *u = (int32_t*)&vLastVal;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}